

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_cpio_odc.c
# Opt level: O1

int write_header(archive_write *a,archive_entry *entry)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  wchar_t wVar4;
  uint uVar5;
  mode_t mVar6;
  int iVar7;
  int iVar8;
  archive_string_conv *sc;
  int *piVar9;
  char *pcVar10;
  dev_t dVar11;
  la_int64_t lVar12;
  void *pvVar13;
  time_t v;
  size_t sVar14;
  uint *puVar15;
  char *pcVar16;
  long lVar17;
  long lVar18;
  la_int64_t *plVar19;
  ulong uVar20;
  size_t length;
  size_t len;
  char *p;
  char *path;
  char h [76];
  int local_b4;
  size_t local_b0;
  la_int64_t *local_a8;
  char *local_a0;
  size_t local_98;
  char *local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined8 uStack_44;
  
  plVar19 = (la_int64_t *)a->format_data;
  sc = get_sconv(a);
  wVar4 = _archive_entry_pathname_l(entry,&local_90,&local_b0,sc);
  uVar20 = 0;
  local_b4 = 0;
  if (wVar4 == L'\0') {
LAB_001542f6:
    local_98 = local_b0;
    local_88 = 0;
    uStack_80 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_58 = 0;
    uStack_50 = 0;
    uStack_4c = 0;
    uStack_48 = 0;
    uStack_44 = 0;
    format_octal(0x71c7,&local_88,6);
    dVar11 = archive_entry_dev(entry);
    format_octal(dVar11,(void *)((long)&local_88 + 6),6);
    lVar12 = archive_entry_ino64(entry);
    if (lVar12 != 0) {
      uVar5 = archive_entry_nlink(entry);
      if (uVar5 < 2) {
        uVar20 = plVar19[1] + 1;
        plVar19[1] = uVar20;
      }
      else {
        uVar1 = plVar19[4];
        if (uVar1 != 0) {
          puVar15 = (uint *)(plVar19[2] + 8);
          uVar20 = uVar1;
          do {
            if (*(long *)(puVar15 + -2) == lVar12) {
              uVar20 = (ulong)*puVar15;
              goto LAB_0015441e;
            }
            puVar15 = puVar15 + 4;
            uVar20 = uVar20 - 1;
          } while (uVar20 != 0);
        }
        uVar2 = plVar19[3];
        uVar20 = plVar19[1] + 1;
        plVar19[1] = uVar20;
        if (uVar2 <= uVar1) {
          lVar18 = uVar2 * 2;
          if (uVar2 < 0x200) {
            lVar18 = 0x200;
          }
          local_a8 = plVar19;
          pvVar13 = realloc((void *)plVar19[2],lVar18 << 4);
          plVar19 = local_a8;
          if (pvVar13 == (void *)0x0) {
            uVar20 = 0xffffffff;
            goto LAB_0015441e;
          }
          local_a8[3] = lVar18;
          local_a8[2] = (la_int64_t)pvVar13;
        }
        lVar18 = plVar19[2];
        lVar3 = plVar19[4];
        lVar17 = lVar3 * 0x10;
        *(la_int64_t *)(lVar18 + lVar17) = lVar12;
        *(int *)(lVar18 + 8 + lVar17) = (int)uVar20;
        plVar19[4] = lVar3 + 1;
      }
    }
LAB_0015441e:
    uVar5 = (uint)uVar20;
    if ((int)uVar5 < 0) {
      pcVar16 = "No memory for ino translation table";
      goto LAB_00154580;
    }
    if ((int)uVar5 < 0x40000) {
      format_octal((ulong)(uVar5 & 0x3ffff),(void *)((long)&uStack_80 + 4),6);
      mVar6 = archive_entry_mode(entry);
      format_octal((ulong)mVar6,(void *)((long)&local_78 + 2),6);
      lVar12 = archive_entry_uid(entry);
      format_octal(lVar12,&uStack_70,6);
      lVar12 = archive_entry_gid(entry);
      format_octal(lVar12,(void *)((long)&uStack_70 + 6),6);
      uVar5 = archive_entry_nlink(entry);
      format_octal((ulong)uVar5,(void *)((long)&local_68 + 4),6);
      mVar6 = archive_entry_filetype(entry);
      if ((mVar6 == 0x6000) || (mVar6 = archive_entry_filetype(entry), mVar6 == 0x2000)) {
        dVar11 = archive_entry_rdev(entry);
      }
      else {
        dVar11 = 0;
      }
      format_octal(dVar11,(void *)((long)&uStack_60 + 2),6);
      v = archive_entry_mtime(entry);
      format_octal(v,&local_58,0xb);
      length = (size_t)((int)local_98 + 1);
      format_octal(length,(void *)((long)&uStack_50 + 3),6);
      mVar6 = archive_entry_filetype(entry);
      if (mVar6 != 0x8000) {
        archive_entry_set_size(entry,0);
      }
      wVar4 = _archive_entry_symlink_l(entry,&local_a0,&local_b0,sc);
      if (wVar4 != L'\0') {
        piVar9 = __errno_location();
        if (*piVar9 == 0xc) {
          pcVar16 = "Can\'t allocate memory for Linkname";
          goto LAB_00154580;
        }
        pcVar16 = archive_entry_symlink(entry);
        pcVar10 = archive_string_conversion_charset_name(sc);
        archive_set_error(&a->archive,0x54,"Can\'t translate linkname \'%s\' to %s",pcVar16,pcVar10)
        ;
        local_b4 = -0x14;
      }
      if ((local_a0 == (char *)0x0 || local_b0 == 0) || (*local_a0 == '\0')) {
        sVar14 = archive_entry_size(entry);
      }
      else {
        sVar14 = strlen(local_a0);
      }
      iVar7 = format_octal(sVar14,(void *)((long)&uStack_48 + 1),0xb);
      if (iVar7 == 0) {
        iVar8 = __archive_write_output(a,&local_88,0x4c);
        iVar7 = -0x1e;
        if ((iVar8 == 0) && (iVar8 = __archive_write_output(a,local_90,length), iVar8 == 0)) {
          lVar12 = archive_entry_size(entry);
          *plVar19 = lVar12;
          iVar7 = local_b4;
          if ((local_a0 != (char *)0x0) && (*local_a0 != '\0')) {
            sVar14 = strlen(local_a0);
            iVar8 = __archive_write_output(a,local_a0,sVar14);
            iVar7 = -0x1e;
            if (iVar8 == 0) {
              iVar7 = local_b4;
            }
          }
        }
      }
      else {
        archive_set_error(&a->archive,0x22,"File is too large for cpio format.");
        iVar7 = -0x19;
      }
      goto LAB_00154594;
    }
    pcVar16 = "Too many files for this cpio format";
    iVar7 = 0x22;
  }
  else {
    piVar9 = __errno_location();
    if (*piVar9 != 0xc) {
      pcVar16 = archive_entry_pathname(entry);
      pcVar10 = archive_string_conversion_charset_name(sc);
      archive_set_error(&a->archive,0x54,"Can\'t translate pathname \'%s\' to %s",pcVar16,pcVar10);
      local_b4 = -0x14;
      goto LAB_001542f6;
    }
    pcVar16 = "Can\'t allocate memory for Pathname";
LAB_00154580:
    iVar7 = 0xc;
  }
  archive_set_error(&a->archive,iVar7,pcVar16);
  iVar7 = -0x1e;
LAB_00154594:
  archive_entry_free((archive_entry *)0x0);
  return iVar7;
}

Assistant:

static int
write_header(struct archive_write *a, struct archive_entry *entry)
{
	struct cpio *cpio;
	const char *p, *path;
	int pathlength, ret, ret_final;
	int64_t	ino;
	char h[76];
	struct archive_string_conv *sconv;
	struct archive_entry *entry_main;
	size_t len;

	cpio = (struct cpio *)a->format_data;
	ret_final = ARCHIVE_OK;
	sconv = get_sconv(a);

#if defined(_WIN32) && !defined(__CYGWIN__)
	/* Make sure the path separators in pathname, hardlink and symlink
	 * are all slash '/', not the Windows path separator '\'. */
	entry_main = __la_win_entry_in_posix_pathseparator(entry);
	if (entry_main == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate ustar data");
		return(ARCHIVE_FATAL);
	}
	if (entry != entry_main)
		entry = entry_main;
	else
		entry_main = NULL;
#else
	entry_main = NULL;
#endif

	ret = archive_entry_pathname_l(entry, &path, &len, sconv);
	if (ret != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Pathname");
			ret_final = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't translate pathname '%s' to %s",
		    archive_entry_pathname(entry),
		    archive_string_conversion_charset_name(sconv));
		ret_final = ARCHIVE_WARN;
	}
	/* Include trailing null. */
	pathlength = (int)len + 1;

	memset(h, 0, sizeof(h));
	format_octal(070707, h + c_magic_offset, c_magic_size);
	format_octal(archive_entry_dev(entry), h + c_dev_offset, c_dev_size);

	ino = synthesize_ino_value(cpio, entry);
	if (ino < 0) {
		archive_set_error(&a->archive, ENOMEM,
		    "No memory for ino translation table");
		ret_final = ARCHIVE_FATAL;
		goto exit_write_header;
	} else if (ino > 0777777) {
		archive_set_error(&a->archive, ERANGE,
		    "Too many files for this cpio format");
		ret_final = ARCHIVE_FATAL;
		goto exit_write_header;
	}
	format_octal(ino & 0777777, h + c_ino_offset, c_ino_size);

	/* TODO: Set ret_final to ARCHIVE_WARN if any of these overflow. */
	format_octal(archive_entry_mode(entry), h + c_mode_offset, c_mode_size);
	format_octal(archive_entry_uid(entry), h + c_uid_offset, c_uid_size);
	format_octal(archive_entry_gid(entry), h + c_gid_offset, c_gid_size);
	format_octal(archive_entry_nlink(entry), h + c_nlink_offset, c_nlink_size);
	if (archive_entry_filetype(entry) == AE_IFBLK
	    || archive_entry_filetype(entry) == AE_IFCHR)
	    format_octal(archive_entry_rdev(entry), h + c_rdev_offset, c_rdev_size);
	else
	    format_octal(0, h + c_rdev_offset, c_rdev_size);
	format_octal(archive_entry_mtime(entry), h + c_mtime_offset, c_mtime_size);
	format_octal(pathlength, h + c_namesize_offset, c_namesize_size);

	/* Non-regular files don't store bodies. */
	if (archive_entry_filetype(entry) != AE_IFREG)
		archive_entry_set_size(entry, 0);

	/* Symlinks get the link written as the body of the entry. */
	ret = archive_entry_symlink_l(entry, &p, &len, sconv);
	if (ret != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Linkname");
			ret_final = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't translate linkname '%s' to %s",
		    archive_entry_symlink(entry),
		    archive_string_conversion_charset_name(sconv));
		ret_final = ARCHIVE_WARN;
	}
	if (len > 0 && p != NULL  &&  *p != '\0')
		ret = format_octal(strlen(p), h + c_filesize_offset,
		    c_filesize_size);
	else
		ret = format_octal(archive_entry_size(entry),
		    h + c_filesize_offset, c_filesize_size);
	if (ret) {
		archive_set_error(&a->archive, ERANGE,
		    "File is too large for cpio format.");
		ret_final = ARCHIVE_FAILED;
		goto exit_write_header;
	}

	ret = __archive_write_output(a, h, sizeof(h));
	if (ret != ARCHIVE_OK) {
		ret_final = ARCHIVE_FATAL;
		goto exit_write_header;
	}

	ret = __archive_write_output(a, path, pathlength);
	if (ret != ARCHIVE_OK) {
		ret_final = ARCHIVE_FATAL;
		goto exit_write_header;
	}

	cpio->entry_bytes_remaining = archive_entry_size(entry);

	/* Write the symlink now. */
	if (p != NULL  &&  *p != '\0') {
		ret = __archive_write_output(a, p, strlen(p));
		if (ret != ARCHIVE_OK) {
			ret_final = ARCHIVE_FATAL;
			goto exit_write_header;
		}
	}
exit_write_header:
	archive_entry_free(entry_main);
	return (ret_final);
}